

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O2

cf_int32_t cf_datetime_day_of_year(cf_datetime_t *dt)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = *(ulong *)dt;
  iVar3 = 0;
  uVar2 = (uint)(uVar1 >> 0xc) & 0xf;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = iVar3 + (uint)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"[uVar4];
  }
  return ((uint)uVar1 >> 0x10 & 0x1f) + iVar3 +
         (uint)(2 < uVar2 && ((uVar1 & 3) == 0 && (short)(((uint)uVar1 & 0xffc) % 100) != 0));
}

Assistant:

cf_int32_t cf_datetime_day_of_year(const cf_datetime_t* dt) {
    cf_int32_t d = 0;
    cf_uint32_t i;
    cf_bool_t leap_year = CF_FALSE;
    leap_year = CF_IS_LEAP_YEAR(dt->year);
    for (i = 0; i < dt->month; i++) {
        d += g_mondays[i];
    }
    if (dt->month > 2 && leap_year) d++;
    d += dt->day;
    return d;
}